

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add.hpp
# Opt level: O2

long duckdb::DecimalAddOverflowCheck::Operation<long,long,long>(long left,long right)

{
  OutOfRangeException *this;
  allocator local_41;
  string local_40;
  
  if (right < 0) {
    if (left < -999999999999999999 - right) goto LAB_017d820a;
  }
  else if (999999999999999999 - right < left) {
LAB_017d820a:
    this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_40,
               "Overflow in addition of DECIMAL(18) (%d + %d). You might want to add an explicit cast to a bigger decimal."
               ,&local_41);
    OutOfRangeException::OutOfRangeException<long,long>(this,&local_40,left,right);
    __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return right + left;
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TryDecimalAdd::Operation<TA, TB, TR>(left, right, result)) {
			throw OutOfRangeException("Overflow in addition of DECIMAL(18) (%d + %d). You might want to add an "
			                          "explicit cast to a bigger decimal.",
			                          left, right);
		}
		return result;
	}